

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool operator_null_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  _Bool _Var1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_value_t value;
  
  if ((args->isa == gravity_class_null) && ((args->field_1).n == 1)) {
    if ((args[1].isa == args->isa) && (args[1].field_1.n == 1)) {
      aVar2.n = 1;
    }
    else {
      aVar2.n = 0;
    }
    value.field_1.n = aVar2.n;
    value.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value,rindex);
    return true;
  }
  args->isa = gravity_class_int;
  (args->field_1).n = 0;
  _Var1 = operator_int_cmp(vm,args,nargs,rindex);
  return _Var1;
}

Assistant:

static bool operator_null_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm,nargs)
    if (VALUE_ISA_UNDEFINED(args[0])) {
        // undefined case (undefined is equal ONLY to undefined)
        if (VALUE_ISA_UNDEFINED(args[1])) RETURN_VALUE(VALUE_FROM_BOOL(1), rindex);
        RETURN_VALUE(VALUE_FROM_BOOL(0), rindex);
    }

    args[0] = VALUE_FROM_INT(0);
    return operator_int_cmp(vm, args, nargs, rindex);
}